

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void unlink_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &unlink_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x147,"req == &unlink_req");
    abort();
  }
  if (unlink_req.fs_type != UV_FS_UNLINK) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x148,"req->fs_type == UV_FS_UNLINK");
    abort();
  }
  if (unlink_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x149,"req->result == 0");
    abort();
  }
  unlink_cb_count = unlink_cb_count + 1;
  uv_fs_req_cleanup(&unlink_req);
  return;
}

Assistant:

static void unlink_cb(uv_fs_t* req) {
  ASSERT(req == &unlink_req);
  ASSERT(req->fs_type == UV_FS_UNLINK);
  ASSERT(req->result == 0);
  unlink_cb_count++;
  uv_fs_req_cleanup(req);
}